

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool cmakeCheckStampFile(string *stampName)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  RenameResult RVar4;
  char *pcVar5;
  ulong uVar6;
  ostream *poVar7;
  cmAlphaNum local_750;
  cmAlphaNum local_720;
  string local_6f0;
  Status local_6d0;
  undefined1 local_6c8 [8];
  string err;
  ofstream stamp;
  string stampTemp;
  ostringstream stampTempStream;
  int local_30c;
  undefined1 local_308 [4];
  int result;
  string dep;
  cmFileTimeCache ftc;
  long local_2a0;
  ifstream fin;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string stampDepends;
  string *stampName_local;
  
  stampDepends.field_2._8_8_ = stampName;
  cmAlphaNum::cmAlphaNum(&local_68,stampName);
  cmAlphaNum::cmAlphaNum(&local_98,".depend");
  cmStrCat<>((string *)local_38,&local_68,&local_98);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_2a0,pcVar5,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_2a0 + *(long *)(local_2a0 + -0x18)));
  if ((bVar1 & 1) == 0) {
    cmFileTimeCache::cmFileTimeCache((cmFileTimeCache *)((long)&dep.field_2 + 8));
    std::__cxx11::string::string((string *)local_308);
    do {
      bVar2 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&local_2a0,(string *)local_308,(bool *)0x0,0xffffffffffffffff);
      if (!bVar2) {
        bVar2 = false;
        goto LAB_00522d40;
      }
      uVar6 = std::__cxx11::string::empty();
    } while ((((uVar6 & 1) != 0) ||
             (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_308), *pcVar5 == '#'))
            || ((bVar2 = cmFileTimeCache::Compare
                                   ((cmFileTimeCache *)((long)&dep.field_2 + 8),(string *)local_38,
                                    (string *)local_308,&local_30c), bVar2 && (-1 < local_30c))));
    poVar7 = std::operator<<((ostream *)&std::cout,"CMake is re-running because ");
    poVar7 = std::operator<<(poVar7,(string *)stampDepends.field_2._8_8_);
    std::operator<<(poVar7," is out-of-date.\n");
    poVar7 = std::operator<<((ostream *)&std::cout,"  the file \'");
    poVar7 = std::operator<<(poVar7,(string *)local_308);
    std::operator<<(poVar7,"\'\n");
    poVar7 = std::operator<<((ostream *)&std::cout,"  is newer than \'");
    poVar7 = std::operator<<(poVar7,(string *)local_38);
    std::operator<<(poVar7,"\'\n");
    poVar7 = std::operator<<((ostream *)&std::cout,"  result=\'");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_30c);
    std::operator<<(poVar7,"\'\n");
    stampName_local._7_1_ = 0;
    bVar2 = true;
LAB_00522d40:
    std::__cxx11::string::~string((string *)local_308);
    cmFileTimeCache::~cmFileTimeCache((cmFileTimeCache *)((long)&dep.field_2 + 8));
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)(stampTemp.field_2._M_local_buf + 8));
      poVar7 = std::operator<<((ostream *)((long)&stampTemp.field_2 + 8),
                               (string *)stampDepends.field_2._8_8_);
      poVar7 = std::operator<<(poVar7,".tmp");
      uVar3 = cmSystemTools::RandomSeed();
      std::ostream::operator<<(poVar7,uVar3);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream((void *)((long)&err.field_2 + 8),pcVar5,_S_out);
      std::operator<<((ostream *)((long)&err.field_2 + 8),
                      "# CMake generation timestamp file for this directory.\n");
      std::ofstream::~ofstream((void *)((long)&err.field_2 + 8));
      std::__cxx11::string::string((string *)local_6c8);
      RVar4 = cmSystemTools::RenameFile
                        ((string *)&stamp.field_0x1f8,(string *)stampDepends.field_2._8_8_,Yes,
                         (string *)local_6c8);
      if (RVar4 != Success) {
        local_6d0 = cmsys::SystemTools::RemoveFile((string *)&stamp.field_0x1f8);
        cmAlphaNum::cmAlphaNum(&local_720,"Cannot restore timestamp \"");
        cmAlphaNum::cmAlphaNum(&local_750,(string *)stampDepends.field_2._8_8_);
        cmStrCat<char[4],std::__cxx11::string>
                  (&local_6f0,&local_720,&local_750,(char (*) [4])0xd4192f,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8);
        cmSystemTools::Error(&local_6f0);
        std::__cxx11::string::~string((string *)&local_6f0);
      }
      stampName_local._7_1_ = RVar4 == Success;
      std::__cxx11::string::~string((string *)local_6c8);
      std::__cxx11::string::~string((string *)&stamp.field_0x1f8);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)(stampTemp.field_2._M_local_buf + 8));
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"CMake is re-running because ");
    poVar7 = std::operator<<(poVar7,(string *)stampDepends.field_2._8_8_);
    std::operator<<(poVar7," dependency file is missing.\n");
    stampName_local._7_1_ = 0;
  }
  std::ifstream::~ifstream(&local_2a0);
  std::__cxx11::string::~string((string *)local_38);
  return (bool)(stampName_local._7_1_ & 1);
}

Assistant:

static bool cmakeCheckStampFile(const std::string& stampName)
{
  // The stamp file does not exist.  Use the stamp dependencies to
  // determine whether it is really out of date.  This works in
  // conjunction with cmLocalVisualStudio7Generator to avoid
  // repeatedly re-running CMake when the user rebuilds the entire
  // solution.
  std::string stampDepends = cmStrCat(stampName, ".depend");
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(stampDepends.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(stampDepends.c_str());
#endif
  if (!fin) {
    // The stamp dependencies file cannot be read.  Just assume the
    // build system is really out of date.
    std::cout << "CMake is re-running because " << stampName
              << " dependency file is missing.\n";
    return false;
  }

  // Compare the stamp dependencies against the dependency file itself.
  {
    cmFileTimeCache ftc;
    std::string dep;
    while (cmSystemTools::GetLineFromStream(fin, dep)) {
      int result;
      if (!dep.empty() && dep[0] != '#' &&
          (!ftc.Compare(stampDepends, dep, &result) || result < 0)) {
        // The stamp depends file is older than this dependency.  The
        // build system is really out of date.
        std::cout << "CMake is re-running because " << stampName
                  << " is out-of-date.\n";
        std::cout << "  the file '" << dep << "'\n";
        std::cout << "  is newer than '" << stampDepends << "'\n";
        std::cout << "  result='" << result << "'\n";
        return false;
      }
    }
  }

  // The build system is up to date.  The stamp file has been removed
  // by the VS IDE due to a "rebuild" request.  Restore it atomically.
  std::ostringstream stampTempStream;
  stampTempStream << stampName << ".tmp" << cmSystemTools::RandomSeed();
  std::string stampTemp = stampTempStream.str();
  {
    // TODO: Teach cmGeneratedFileStream to use a random temp file (with
    // multiple tries in unlikely case of conflict) and use that here.
    cmsys::ofstream stamp(stampTemp.c_str());
    stamp << "# CMake generation timestamp file for this directory.\n";
  }
  std::string err;
  if (cmSystemTools::RenameFile(stampTemp, stampName,
                                cmSystemTools::Replace::Yes, &err) ==
      cmSystemTools::RenameResult::Success) {
    // CMake does not need to re-run because the stamp file is up-to-date.
    return true;
  }
  cmSystemTools::RemoveFile(stampTemp);
  cmSystemTools::Error(
    cmStrCat("Cannot restore timestamp \"", stampName, "\": ", err));
  return false;
}